

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIfif.c
# Opt level: O1

void Abc_NtkPerformIfif(Abc_Ntk_t *pNtk,Ifif_Par_t *pPars)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Abc_Obj_t *pObj;
  void *pvVar5;
  bool bVar6;
  Abc_IffMan_t *p;
  Abc_IffObj_t *pAVar7;
  Vec_Ptr_t *pVVar8;
  char *pcVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  double dVar15;
  double dVar16;
  
  if (6 < (uint)pPars->pLutLib->LutMax) {
    __assert_fail("pPars->pLutLib->LutMax >= 0 && pPars->pLutLib->LutMax <= IFIF_MAX_LEAVES",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcIfif.c"
                  ,0x107,"void Abc_NtkPerformIfif(Abc_Ntk_t *, Ifif_Par_t *)");
  }
  if (6 < (uint)pPars->nLutSize) {
    __assert_fail("pPars->nLutSize >= 0 && pPars->nLutSize <= IFIF_MAX_LEAVES",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcIfif.c"
                  ,0x108,"void Abc_NtkPerformIfif(Abc_Ntk_t *, Ifif_Par_t *)");
  }
  if (6 < (uint)pPars->nDegree) {
    __assert_fail("pPars->nDegree >= 0 && pPars->nDegree <= IFIF_MAX_LEAVES",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcIfif.c"
                  ,0x109,"void Abc_NtkPerformIfif(Abc_Ntk_t *, Ifif_Par_t *)");
  }
  Abc_NtkToAig(pNtk);
  Abc_NtkLevel(pNtk);
  if (pPars->fVerbose != 0) {
    puts("Running mapper into LUT structures with the following parameters:");
    printf("Pin+Wire: {");
    if (0 < pPars->pLutLib->LutMax) {
      lVar12 = 0;
      do {
        printf(" %3.2f",(double)pPars->pLutDelays[lVar12]);
        lVar12 = lVar12 + 1;
      } while (lVar12 < pPars->pLutLib->LutMax);
    }
    printf(" }  ");
    pcVar9 = "Cascade";
    if (pPars->fCascade == 0) {
      pcVar9 = "Cluster";
    }
    printf("Wire %3.2f  Degree %d  Type: %s\n",(double)pPars->DelayWire,(ulong)(uint)pPars->nDegree,
           pcVar9);
  }
  p = (Abc_IffMan_t *)calloc(1,0x20);
  p->pNtk = pNtk;
  p->pPars = pPars;
  iVar2 = pNtk->vObjs->nSize;
  p->nObjs = iVar2;
  pAVar7 = (Abc_IffObj_t *)calloc((long)iVar2,0x1c);
  p->pObjs = pAVar7;
  pVVar8 = Abc_NtkDfs(pNtk,0);
  if (0 < pVVar8->nSize) {
    lVar12 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar8->pArray[lVar12];
      if ((*(uint *)&pObj->field_0x14 & 0xf) != 7) {
        __assert_fail("Abc_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcIfif.c"
                      ,0x122,"void Abc_NtkPerformIfif(Abc_Ntk_t *, Ifif_Par_t *)");
      }
      uVar3 = pObj->Id;
      if (((int)uVar3 < 0) || (p->nObjs <= (int)uVar3)) goto LAB_002650d6;
      pAVar7 = p->pObjs + uVar3;
      if (pPars->fCascade == 0) {
        fVar13 = Abc_ObjDelay0(p,pObj);
        pAVar7->Delay[0] = fVar13;
        fVar13 = Abc_ObjDelay1(p,pObj);
        pAVar7->Delay[1] = fVar13;
      }
      else if (-1 < pPars->nDegree) {
        lVar10 = 0;
        do {
          fVar13 = Abc_ObjDelayDegree(p,pObj,(int)lVar10);
          pAVar7->Delay[lVar10] = fVar13;
          bVar6 = lVar10 < pPars->nDegree;
          lVar10 = lVar10 + 1;
        } while (bVar6);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar8->nSize);
  }
  if (pPars->fCascade == 0) {
    fVar13 = 1.0;
  }
  else {
    fVar13 = (float)pPars->nDegree;
  }
  if ((p->pPars->fVeryVerbose != 0) && (0 < pVVar8->nSize)) {
    lVar12 = 0;
    do {
      pvVar5 = pVVar8->pArray[lVar12];
      printf("Node %3d : Lev =%3d   ",(ulong)*(uint *)((long)pvVar5 + 0x10),
             (ulong)(*(uint *)((long)pvVar5 + 0x14) >> 0xc));
      if (0.0 <= fVar13) {
        lVar10 = 0;
        do {
          iVar2 = *(int *)((long)pvVar5 + 0x10);
          if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_002650d6;
          printf("Del%d =%4.2f  ",(double)p->pObjs[iVar2].Delay[lVar10]);
          lVar10 = lVar10 + 1;
        } while ((float)(int)lVar10 <= fVar13);
      }
      putchar(10);
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar8->nSize);
  }
  if (pVVar8->pArray != (void **)0x0) {
    free(pVVar8->pArray);
    pVVar8->pArray = (void **)0x0;
  }
  if (pVVar8 != (Vec_Ptr_t *)0x0) {
    free(pVVar8);
  }
  pVVar8 = pNtk->vCos;
  iVar2 = pVVar8->nSize;
  lVar12 = (long)iVar2;
  dVar16 = 0.0;
  dVar15 = 0.0;
  if (0 < lVar12) {
    fVar14 = 0.0;
    lVar10 = 0;
    do {
      iVar11 = *(int *)(*(long *)(*(long *)(*(long *)(*pVVar8->pArray[lVar10] + 0x20) + 8) +
                                 (long)**(int **)((long)pVVar8->pArray[lVar10] + 0x20) * 8) + 0x10);
      if (((long)iVar11 < 0) || (p->nObjs <= iVar11)) goto LAB_002650d6;
      fVar1 = p->pObjs[iVar11].Delay[(int)fVar13];
      if (fVar14 <= fVar1) {
        fVar14 = fVar1;
      }
      lVar10 = lVar10 + 1;
    } while (lVar12 != lVar10);
    dVar15 = (double)fVar14;
  }
  if (0 < iVar2) {
    lVar10 = 0;
    iVar11 = 0;
    do {
      iVar4 = *(int *)(*(long *)(*(long *)(*(long *)(*pVVar8->pArray[lVar10] + 0x20) + 8) +
                                (long)**(int **)((long)pVVar8->pArray[lVar10] + 0x20) * 8) + 0x10);
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
LAB_002650d6:
        __assert_fail("i >= 0 && i < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcIfif.c"
                      ,0x33,"Abc_IffObj_t *Abc_IffObj(Abc_IffMan_t *, int)");
      }
      iVar11 = (iVar11 + 1) - (uint)(p->pObjs[iVar4].Delay[(int)fVar13] < (float)(dVar15 * 0.9));
      lVar10 = lVar10 + 1;
    } while (lVar12 != lVar10);
    dVar16 = (double)iVar11 * 100.0;
  }
  printf("Critical delay %5.2f. Critical outputs %5.2f %%\n",dVar15,dVar16 / (double)iVar2);
  Abc_NtkIfifStop(p);
  return;
}

Assistant:

void Abc_NtkPerformIfif( Abc_Ntk_t * pNtk, Ifif_Par_t * pPars )
{
    Abc_IffMan_t * p;
    Abc_IffObj_t * pIffObj;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    float Delay, Delay10, DegreeFinal;
    int i, d, Count10;
    assert( pPars->pLutLib->LutMax >= 0 && pPars->pLutLib->LutMax <= IFIF_MAX_LEAVES );
    assert( pPars->nLutSize >= 0 && pPars->nLutSize <= IFIF_MAX_LEAVES );
    assert( pPars->nDegree >= 0 && pPars->nDegree <= IFIF_MAX_LEAVES );
    // convert to AIGs
    Abc_NtkToAig( pNtk );
    Abc_NtkLevel( pNtk );

    // print parameters
    if ( pPars->fVerbose )
    {
        printf( "Running mapper into LUT structures with the following parameters:\n" );
        printf( "Pin+Wire: {" );
        for ( i = 0; i < pPars->pLutLib->LutMax; i++ )
            printf( " %3.2f", pPars->pLutDelays[i] );
        printf( " }  " );    
        printf( "Wire %3.2f  Degree %d  Type: %s\n", 
            pPars->DelayWire, pPars->nDegree, pPars->fCascade? "Cascade" : "Cluster" );
    }

    // start manager
    p = Abc_NtkIfifStart( pNtk, pPars );
//    printf( "Running experiment with LUT delay %d and degree %d (LUT size is %d).\n", DelayWire, nDegree, nLutSize );

    // compute the delay
    vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        assert( Abc_ObjIsNode(pObj) );
        pIffObj = Abc_IffObj( p, Abc_ObjId(pObj) );

        if ( pPars->fCascade )
        {
            for ( d = 0; d <= pPars->nDegree; d++ )
                pIffObj->Delay[d] = Abc_ObjDelayDegree( p, pObj, d );
        }
        else
        {
            pIffObj->Delay[0] = Abc_ObjDelay0( p, pObj );
            pIffObj->Delay[1] = Abc_ObjDelay1( p, pObj );
        }
    }

    // get final degree number
    if ( pPars->fCascade )
        DegreeFinal = pPars->nDegree;
    else
        DegreeFinal = 1;

    if ( p->pPars->fVeryVerbose )
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        printf( "Node %3d : Lev =%3d   ",  Abc_ObjId(pObj), Abc_ObjLevel(pObj) );
        for ( d = 0; d <= DegreeFinal; d++ )
            printf( "Del%d =%4.2f  ", d, Abc_IffDelay(p, pObj, d) );
        printf( "\n" );
    }
    Vec_PtrFree( vNodes );


    // consider delay at the outputs
    Delay = 0;
    Abc_NtkForEachCo( pNtk, pObj, i )
        Delay = Abc_MaxFloat( Delay, Abc_IffDelay(p, Abc_ObjFanin0(pObj), DegreeFinal) );
    Delay10 = 0.9 * Delay;

    // consider delay at the outputs
    Count10 = 0;
    Abc_NtkForEachCo( pNtk, pObj, i )
        if ( Abc_IffDelay(p, Abc_ObjFanin0(pObj), DegreeFinal) >= Delay10 )
            Count10++;

    printf( "Critical delay %5.2f. Critical outputs %5.2f %%\n", Delay, 100.0 * Count10 / Abc_NtkCoNum(pNtk) );
//    printf( "%.2f %.2f\n", Delay, 100.0 * Count10 / Abc_NtkCoNum(pNtk) );

    // derive a new network

    // stop manager
    Abc_NtkIfifStop( p );
}